

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5InterrogatorBasicData.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::Mode5InterrogatorBasicData::Mode5InterrogatorBasicData
          (Mode5InterrogatorBasicData *this,Mode5InterrogatorStatus *Status,KUINT32 FormatsPresent,
          EntityIdentifier *ID)

{
  KUINT16 KVar1;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__Mode5InterrogatorBasicData_00225810;
  (this->m_Status).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__Mode5InterrogatorStatus_00225868;
  (this->m_Status).m_StatusUnion = Status->m_StatusUnion;
  this->m_ui8Padding = '\0';
  this->m_ui16Padding1 = 0;
  this->m_ui32MsgFormats = FormatsPresent;
  (this->m_InterrogatedID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00223808;
  KVar1 = (ID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_InterrogatedID).super_SimulationIdentifier.m_ui16SiteID =
       (ID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_InterrogatedID).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_InterrogatedID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_002234a8;
  *(undefined2 *)&(this->m_InterrogatedID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(ID->super_SimulationIdentifier).field_0xc;
  this->m_ui16Padding2 = 0;
  return;
}

Assistant:

Mode5InterrogatorBasicData::Mode5InterrogatorBasicData( const Mode5InterrogatorStatus & Status, KUINT32 FormatsPresent, const EntityIdentifier & ID ) :
	m_Status( Status ),
	m_ui8Padding( 0 ),
	m_ui16Padding1( 0 ),
	m_ui32MsgFormats( FormatsPresent ),
	m_InterrogatedID( ID ),
	m_ui16Padding2( 0 )
{
}